

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O0

void __thiscall
eos::morphablemodel::MorphableModel::serialize<cereal::BinaryInputArchive>
          (MorphableModel *this,BinaryInputArchive *archive,uint32_t version)

{
  runtime_error *prVar1;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  NameValuePair<std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_&>
  local_150;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_140;
  NameValuePair<std::optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_&>
  local_130;
  NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
  local_120;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_110;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_100;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_f0;
  NameValuePair<std::optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_&>
  local_e0;
  NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
  local_d0;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_c0;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_b0;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_a0;
  NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
  local_90;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_80;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_70;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_60;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_50;
  NameValuePair<eos::morphablemodel::PcaModel_&> local_40 [2];
  uint32_t local_1c;
  BinaryInputArchive *pBStack_18;
  uint32_t version_local;
  BinaryInputArchive *archive_local;
  MorphableModel *this_local;
  
  local_1c = version;
  pBStack_18 = archive;
  archive_local = (BinaryInputArchive *)this;
  if (version == 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,
               "The model file you are trying to load is in an old format. Please download the most recent model files."
              );
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (version == 1) {
    local_40[0] = cereal::make_nvp<eos::morphablemodel::PcaModel&>("shape_model",&this->shape_model)
    ;
    local_50 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("color_model",&this->color_model);
    local_60 = cereal::
               make_nvp<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>
                         ("texture_coordinates",&this->texture_coordinates);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,local_40,&local_50,&local_60);
  }
  else if (version == 2) {
    local_70 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("shape_model",&this->shape_model);
    local_80 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("color_model",&this->color_model);
    local_90 = cereal::
               make_nvp<std::optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>&>
                         ("expression_model",&this->expression_model);
    local_a0 = cereal::
               make_nvp<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>
                         ("texture_coordinates",&this->texture_coordinates);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,&local_70,&local_80,&local_90,
               &local_a0);
  }
  else if (version == 3) {
    local_b0 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("shape_model",&this->shape_model);
    local_c0 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("color_model",&this->color_model);
    local_d0 = cereal::
               make_nvp<std::optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>&>
                         ("expression_model",&this->expression_model);
    local_e0 = cereal::
               make_nvp<std::optional<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>&>
                         ("landmark_definitions",&this->landmark_definitions);
    local_f0 = cereal::
               make_nvp<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>
                         ("texture_coordinates",&this->texture_coordinates);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,&local_b0,&local_c0,&local_d0,
               &local_e0,&local_f0);
  }
  else {
    if (version != 4) {
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_190,local_1c);
      std::operator+(&local_170,
                     "The model file you are trying to load has an unknown version number: ",
                     &local_190);
      std::runtime_error::runtime_error(prVar1,(string *)&local_170);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_100 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("shape_model",&this->shape_model);
    local_110 = cereal::make_nvp<eos::morphablemodel::PcaModel&>("color_model",&this->color_model);
    local_120 = cereal::
                make_nvp<std::optional<std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>&>
                          ("expression_model",&this->expression_model);
    local_130 = cereal::
                make_nvp<std::optional<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>&>
                          ("landmark_definitions",&this->landmark_definitions);
    local_140 = cereal::
                make_nvp<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>&>
                          ("texture_coordinates",&this->texture_coordinates);
    local_150 = cereal::
                make_nvp<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>&>
                          ("texture_triangle_indices",&this->texture_triangle_indices);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,&local_100,&local_110,
               &local_120,&local_130,&local_140,&local_150);
  }
  return;
}

Assistant:

void serialize(Archive& archive, const std::uint32_t version)
    {
        if (version < 1)
        {
            throw std::runtime_error("The model file you are trying to load is in an old format. Please "
                                     "download the most recent model files.");
        }
        if (version == 1)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(texture_coordinates));
        } else if (version == 2)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(texture_coordinates));
        } else if (version == 3)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates));
        } else if (version == 4)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates),
                    CEREAL_NVP(texture_triangle_indices));
        } else
        {
            throw std::runtime_error("The model file you are trying to load has an unknown version number: " +
                                     std::to_string(version));
        }
    }